

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeGetRequestedReserve(Btree *p)

{
  uint uVar1;
  uint local_1c;
  int n2;
  int n1;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  uVar1 = (uint)p->pBt->nReserveWanted;
  local_1c = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  if ((int)local_1c < (int)uVar1) {
    local_1c = uVar1;
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetRequestedReserve(Btree *p){
  int n1, n2;
  sqlite3BtreeEnter(p);
  n1 = (int)p->pBt->nReserveWanted;
  n2 = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  return n1>n2 ? n1 : n2;
}